

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O3

void __thiscall
tinyjson::json_node::_serialize
          (json_node *this,int indent,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *iter,uint indent_size)

{
  double dVar1;
  byte bVar2;
  pointer ppjVar3;
  object *poVar4;
  _List_node_base *p_Var5;
  array *paVar6;
  array *paVar7;
  pointer ppjVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  bool bVar10;
  long lVar11;
  size_t sVar12;
  byte *pbVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  undefined8 unaff_RBP;
  ulong uVar17;
  byte bVar18;
  char cVar19;
  int iVar20;
  int iVar21;
  array *paVar22;
  byte *pbVar23;
  byte *pbVar24;
  pointer ppjVar25;
  undefined1 *puVar26;
  size_t sVar27;
  bool bVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  char buf [32];
  double local_a8;
  undefined4 local_58;
  
  switch(this->type) {
  case null_type:
    pbVar9 = iter->container;
    uVar17 = 5;
    do {
      std::__cxx11::string::push_back((char)pbVar9);
      uVar17 = uVar17 - 1;
    } while (1 < uVar17);
    break;
  case boolean_type:
    cVar19 = (char)iter->container;
    if ((this->storage).bool_val == true) {
      uVar17 = 5;
      do {
        std::__cxx11::string::push_back(cVar19);
        uVar17 = uVar17 - 1;
      } while (1 < uVar17);
    }
    else {
      uVar17 = 6;
      do {
        std::__cxx11::string::push_back(cVar19);
        uVar17 = uVar17 - 1;
      } while (1 < uVar17);
    }
    break;
  case number_type:
    dVar1 = (this->storage).num_val;
    if (NAN(dVar1)) {
      local_58 = 0x6e616e;
    }
    else if (ABS(dVar1) == INFINITY) {
      local_58 = 0x666e69;
    }
    else if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar29 = -dVar1;
      uVar17 = CONCAT71((int7)((ulong)unaff_RBP >> 8),dVar1 < dVar29);
      local_a8 = dVar29;
      if (dVar29 <= dVar1) {
        local_a8 = dVar1;
      }
      dVar30 = log10(local_a8);
      iVar20 = (int)dVar30;
      bVar28 = iVar20 - 0xeU < 0xffffffea;
      if (dVar29 <= dVar1) {
        pbVar23 = (byte *)&local_58;
      }
      else {
        pbVar23 = (byte *)((long)&local_58 + 1);
        local_58 = CONCAT31(local_58._1_3_,0x2d);
      }
      if (!bVar28 && (8 >= iVar20 || dVar29 <= dVar1)) {
        iVar15 = 0;
        if (0 < iVar20) {
          iVar15 = iVar20;
        }
      }
      else {
        uVar16 = (iVar20 >> 0x1f) + iVar20;
        uVar17 = (ulong)uVar16;
        dVar30 = pow(10.0,(double)(int)uVar16);
        local_a8 = local_a8 / dVar30;
        iVar15 = 0;
      }
      do {
        dVar31 = pow(10.0,(double)iVar15);
        dVar30 = ABS(dVar31);
        if (((dVar30 != INFINITY && (dVar30 != 0.0 && (ulong)dVar30 < 0x7ff0000000000000)) &&
            (0xffffffffffffe < (long)dVar30 - 1U || -1 < (long)dVar31)) &&
            (0x3fe < (uint)((long)dVar30 + 0xfff0000000000000U >> 0x35) || -1 < (long)dVar31)) {
          dVar30 = floor(local_a8 / dVar31);
          local_a8 = local_a8 - (double)(int)dVar30 * dVar31;
          *pbVar23 = (char)(int)dVar30 + 0x30;
          pbVar23 = pbVar23 + 1;
        }
        iVar21 = iVar15 + -1;
        if ((iVar15 == 0) && (0.0 < local_a8)) {
          *pbVar23 = 0x2e;
          pbVar23 = pbVar23 + 1;
        }
        bVar10 = 0 < iVar15;
        iVar15 = iVar21;
      } while ((bVar10) || (1e-14 < local_a8));
      pbVar13 = pbVar23;
      if (bVar28 || 8 < iVar20 && dVar1 < dVar29) {
        *pbVar23 = 0x65;
        iVar20 = (int)uVar17;
        if (iVar20 < 1) {
          pbVar23[1] = 0x2d;
          pbVar13 = pbVar23 + 2;
          if (iVar20 == 0) goto LAB_00104555;
          uVar17 = (ulong)(uint)-iVar20;
        }
        else {
          pbVar23[1] = 0x2b;
        }
        pbVar24 = pbVar23 + 2;
        lVar11 = 2;
        pbVar13 = pbVar24;
        do {
          uVar16 = (uint)uVar17;
          *pbVar13 = (char)uVar17 + (char)((uVar17 & 0xffffffff) / 10) * -10 | 0x30;
          pbVar13 = pbVar13 + 1;
          lVar11 = lVar11 + -1;
          uVar17 = (uVar17 & 0xffffffff) / 10;
        } while (9 < uVar16);
        if ((int)lVar11 != 1) {
          lVar14 = 0;
          lVar11 = -lVar11;
          do {
            bVar18 = pbVar24[lVar14];
            bVar2 = pbVar23[lVar11 + 3];
            pbVar24[lVar14] = bVar18 ^ bVar2;
            bVar18 = bVar18 ^ bVar2 ^ pbVar23[lVar11 + 3];
            pbVar23[lVar11 + 3] = bVar18;
            pbVar24[lVar14] = pbVar24[lVar14] ^ bVar18;
            lVar14 = lVar14 + 1;
            bVar28 = lVar14 < lVar11;
            lVar11 = lVar11 + -1;
          } while (bVar28);
        }
      }
LAB_00104555:
      *pbVar13 = 0;
    }
    else {
      local_58 = CONCAT22(local_58._2_2_,0x30);
    }
    sVar12 = strlen((char *)&local_58);
    if (0 < (long)sVar12) {
      pbVar9 = iter->container;
      sVar27 = 0;
      do {
        std::__cxx11::string::push_back((char)pbVar9);
        sVar27 = sVar27 + 1;
      } while (sVar12 != sVar27);
    }
    break;
  case string_type:
    poVar4 = (this->storage).object_val;
    std::__cxx11::string::push_back((char)iter->container);
    p_Var5 = (poVar4->linked_list).
             super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    cVar19 = (char)iter->container;
    if (0 < (long)p_Var5) {
      puVar26 = (undefined1 *)((long)&p_Var5->_M_next + 1);
      do {
        std::__cxx11::string::push_back(cVar19);
        puVar26 = (undefined1 *)((long)puVar26 + 0xffffffffffffffff);
      } while (1 < puVar26);
      cVar19 = (char)iter->container;
    }
    goto LAB_001042c0;
  case array_type:
    std::__cxx11::string::push_back((char)iter->container);
    iVar20 = -1;
    if (indent + 1 != 0) {
      iVar20 = indent + 1;
    }
    ppjVar8 = (((this->storage).array_val)->
              super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppjVar3 = (((this->storage).array_val)->
              super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppjVar8 != ppjVar3) {
      ppjVar25 = ppjVar8;
      do {
        if (ppjVar25 != ppjVar8) {
          std::__cxx11::string::push_back((char)iter->container);
        }
        if (iVar20 == -1) {
          iVar15 = -1;
        }
        else {
          std::__cxx11::string::push_back((char)iter->container);
          for (iVar21 = iVar20 * indent_size; iVar15 = iVar20, iVar21 != 0; iVar21 = iVar21 + -1) {
            std::__cxx11::string::push_back((char)iter->container);
          }
        }
        _serialize(*ppjVar25,iVar15,iter,indent_size);
        ppjVar25 = ppjVar25 + 1;
      } while (ppjVar25 != ppjVar3);
    }
    if ((iVar20 != -1) &&
       ((((this->storage).array_val)->
        super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (((this->storage).array_val)->
        super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>)._M_impl.
        super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::push_back((char)iter->container);
      for (iVar20 = (iVar20 + -1) * indent_size; iVar20 != 0; iVar20 = iVar20 + -1) {
        std::__cxx11::string::push_back((char)iter->container);
      }
    }
    cVar19 = (char)iter->container;
    goto LAB_001042c0;
  case object_type:
    std::__cxx11::string::push_back((char)iter->container);
    iVar20 = -1;
    if (indent + 1 != 0) {
      iVar20 = indent + 1;
    }
    paVar6 = (this->storage).array_val;
    paVar7 = (array *)(paVar6->
                      super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    if (paVar7 != paVar6) {
      paVar22 = paVar7;
      do {
        if (paVar22 != paVar7) {
          std::__cxx11::string::push_back((char)iter->container);
        }
        cVar19 = (char)iter->container;
        if (iVar20 == -1) {
          std::__cxx11::string::push_back(cVar19);
          ppjVar8 = paVar22[1].
                    super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          cVar19 = (char)iter->container;
          if (0 < (long)ppjVar8) {
            uVar17 = (long)ppjVar8 + 1;
            do {
              std::__cxx11::string::push_back(cVar19);
              uVar17 = uVar17 - 1;
            } while (1 < uVar17);
            cVar19 = (char)iter->container;
          }
          std::__cxx11::string::push_back(cVar19);
          iVar15 = -1;
        }
        else {
          std::__cxx11::string::push_back(cVar19);
          for (iVar15 = iVar20 * indent_size; iVar15 != 0; iVar15 = iVar15 + -1) {
            std::__cxx11::string::push_back((char)iter->container);
          }
          std::__cxx11::string::push_back((char)iter->container);
          ppjVar8 = paVar22[1].
                    super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          cVar19 = (char)iter->container;
          if (0 < (long)ppjVar8) {
            uVar17 = (long)ppjVar8 + 1;
            do {
              std::__cxx11::string::push_back(cVar19);
              uVar17 = uVar17 - 1;
            } while (1 < uVar17);
            cVar19 = (char)iter->container;
          }
          std::__cxx11::string::push_back(cVar19);
          std::__cxx11::string::push_back((char)iter->container);
          iVar15 = iVar20;
        }
        std::__cxx11::string::push_back((char)iter->container);
        _serialize((json_node *)
                   paVar22[2].
                   super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,iVar15,iter,indent_size);
        paVar22 = (array *)(paVar22->
                           super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                           )._M_impl.super__Vector_impl_data._M_start;
      } while (paVar22 != paVar6);
    }
    if ((iVar20 != -1) &&
       ((array *)(((this->storage).array_val)->
                 super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>).
                 _M_impl.super__Vector_impl_data._M_start != (this->storage).array_val)) {
      std::__cxx11::string::push_back((char)iter->container);
      for (iVar20 = (iVar20 + -1) * indent_size; iVar20 != 0; iVar20 = iVar20 + -1) {
        std::__cxx11::string::push_back((char)iter->container);
      }
    }
    cVar19 = (char)iter->container;
LAB_001042c0:
    std::__cxx11::string::push_back(cVar19);
    return;
  }
  return;
}

Assistant:

void _serialize(int indent, std::back_insert_iterator<string>& iter, unsigned int indent_size) const {
      switch (type) {
        case node_type::string_type:
          serialize_str(*(storage.str_val), iter);
          break;
        case node_type::object_type: {
          iter++ = '{';
          if (indent != -1) {
            ++indent;
          }
          auto cbegin = storage.object_val->cbegin();
          auto cend = storage.object_val->cend();
          for (auto citer = cbegin; citer != cend; ++citer) {
            if (citer != cbegin) {
              iter++ = ',';
            }
            if (indent != -1) {
              make_indent(indent, iter, indent_size);
            }
            serialize_str(citer->first, iter);
            iter++ = ':';
            if (indent != -1) {
              iter++ = ' ';
            }
            citer->second->_serialize(indent, iter, indent_size);
          }
          if (indent != -1) {
            --indent;
            if (!storage.object_val->empty()) {
              make_indent(indent, iter, indent_size);
            }
          }
          iter++ = '}';
          break;
        }
        case node_type::array_type: {
          iter++ = '[';
          if (indent != -1) {
            ++indent;
          }
          auto cbegin = storage.array_val->cbegin();
          auto cend = storage.array_val->cend();
          for (auto citer = cbegin; citer != cend; ++citer) {
            if (citer != cbegin) {
              iter++ = ',';
            }
            if (indent != -1) {
              make_indent(indent, iter, indent_size);
            }
            (*citer)->_serialize(indent, iter, indent_size);
          }
          if (indent != -1) {
            --indent;
            if (!storage.array_val->empty()) {
              make_indent(indent, iter, indent_size);
            }
          }
          iter++ = ']';
          break;
        }
        case node_type::null_type: {
		      static const char* n = "null";
          std::copy(n, n + 4, iter);
          break;
		    }
        case node_type::number_type: {
          char buf[MAX_NUMBER_STRING_SIZE];
          const char* c = dtoa(buf, storage.num_val);
          std::copy(c, c + strlen(c), iter);
          break;
        }
        case node_type::boolean_type: {
		      static const char* t = "true";
          static const char* f = "false";
          if (storage.bool_val) {
            std::copy(t, t + 4, iter);
          } else {
            std::copy(f, f + 5, iter);
          }
          break;
		    }
      }
    }